

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O3

void Ga2_ManStop(Ga2_Man_t *p)

{
  Gia_Man_t *pGVar1;
  sat_solver2 *psVar2;
  Vec_Ptr_t *pVVar3;
  void *pvVar4;
  int *piVar5;
  int iVar6;
  uint level;
  Vec_Int_t *pVVar7;
  char **__ptr;
  long lVar8;
  
  pGVar1 = p->pGia;
  pVVar7 = pGVar1->vMapping;
  if (pVVar7 != (Vec_Int_t *)0x0) {
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      pGVar1->vMapping->pArray = (int *)0x0;
      pVVar7 = pGVar1->vMapping;
      if (pVVar7 == (Vec_Int_t *)0x0) goto LAB_005fe792;
    }
    free(pVVar7);
    pGVar1->vMapping = (Vec_Int_t *)0x0;
  }
LAB_005fe792:
  Gia_ManSetPhase(p->pGia);
  if (p->pPars->fVerbose != 0) {
    psVar2 = p->pSat;
    level = psVar2->nDBreduces;
    Abc_Print(level,
              "SAT solver:  Var = %d  Cla = %d  Conf = %d  Lrn = %d  Reduce = %d  Cex = %d  ObjsAdded = %d\n"
              ,(ulong)(uint)psVar2->size,(ulong)(psVar2->stats).clauses,
              (ulong)(uint)(psVar2->stats).conflicts,(ulong)(psVar2->stats).learnts,(ulong)level,
              (ulong)(uint)p->nCexes,(ulong)(uint)p->nObjAdded);
    if (p->pPars->fVerbose != 0) {
      Abc_Print(level,
                "Hash hits = %d.  Hash misses = %d.  Hash overs = %d.  Concurrent calls = %d.\n",
                (ulong)(uint)p->nHashHit,(ulong)(uint)p->nHashMiss,(ulong)(uint)p->nHashOver,
                (ulong)(uint)p->nPdrCalls);
    }
  }
  if (p->pSat != (sat_solver2 *)0x0) {
    sat_solver2_delete(p->pSat);
  }
  pVVar3 = p->vCnfs;
  iVar6 = pVVar3->nSize;
  if (0 < iVar6) {
    lVar8 = 0;
    do {
      pvVar4 = pVVar3->pArray[lVar8];
      if (pvVar4 != (void *)0x0) {
        if (*(void **)((long)pvVar4 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar4 + 8));
        }
        free(pvVar4);
        iVar6 = pVVar3->nSize;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar6);
  }
  if (pVVar3->pArray != (void **)0x0) {
    free(pVVar3->pArray);
  }
  free(pVVar3);
  pVVar3 = p->vId2Lit;
  iVar6 = pVVar3->nSize;
  if (0 < iVar6) {
    lVar8 = 0;
    do {
      pvVar4 = pVVar3->pArray[lVar8];
      if (pvVar4 != (void *)0x0) {
        if (*(void **)((long)pvVar4 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar4 + 8));
        }
        free(pvVar4);
        iVar6 = pVVar3->nSize;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar6);
  }
  if (pVVar3->pArray != (void **)0x0) {
    free(pVVar3->pArray);
  }
  free(pVVar3);
  pVVar7 = p->vIds;
  piVar5 = pVVar7->pArray;
  if (piVar5 != (int *)0x0) {
    free(piVar5);
  }
  free(pVVar7);
  pVVar7 = p->vProofIds;
  piVar5 = pVVar7->pArray;
  if (piVar5 != (int *)0x0) {
    free(piVar5);
  }
  free(pVVar7);
  pVVar7 = p->vAbs;
  piVar5 = pVVar7->pArray;
  if (piVar5 != (int *)0x0) {
    free(piVar5);
  }
  free(pVVar7);
  pVVar7 = p->vValues;
  piVar5 = pVVar7->pArray;
  if (piVar5 != (int *)0x0) {
    free(piVar5);
  }
  free(pVVar7);
  pVVar7 = p->vLits;
  piVar5 = pVVar7->pArray;
  if (piVar5 != (int *)0x0) {
    free(piVar5);
  }
  free(pVVar7);
  pVVar7 = p->vIsopMem;
  piVar5 = pVVar7->pArray;
  if (piVar5 != (int *)0x0) {
    free(piVar5);
  }
  free(pVVar7);
  Rnm_ManStop(p->pRnm,0);
  if (p->pTable != (int *)0x0) {
    free(p->pTable);
    p->pTable = (int *)0x0;
  }
  if (p->pSopSizes != (char *)0x0) {
    free(p->pSopSizes);
    p->pSopSizes = (char *)0x0;
  }
  __ptr = p->pSops;
  if (__ptr[1] != (char *)0x0) {
    free(__ptr[1]);
    p->pSops[1] = (char *)0x0;
    __ptr = p->pSops;
    if (__ptr == (char **)0x0) goto LAB_005fe9e6;
  }
  free(__ptr);
LAB_005fe9e6:
  free(p);
  return;
}

Assistant:

void Ga2_ManStop( Ga2_Man_t * p )
{
    Vec_IntFreeP( &p->pGia->vMapping );
    Gia_ManSetPhase( p->pGia );
    if ( p->pPars->fVerbose )
        Abc_Print( 1, "SAT solver:  Var = %d  Cla = %d  Conf = %d  Lrn = %d  Reduce = %d  Cex = %d  ObjsAdded = %d\n", 
            sat_solver2_nvars(p->pSat), sat_solver2_nclauses(p->pSat), 
            sat_solver2_nconflicts(p->pSat), sat_solver2_nlearnts(p->pSat), 
            p->pSat->nDBreduces, p->nCexes, p->nObjAdded );
    if ( p->pPars->fVerbose )
    Abc_Print( 1, "Hash hits = %d.  Hash misses = %d.  Hash overs = %d.  Concurrent calls = %d.\n", 
        p->nHashHit, p->nHashMiss, p->nHashOver, p->nPdrCalls );

    if( p->pSat ) sat_solver2_delete( p->pSat );
    Vec_VecFree( (Vec_Vec_t *)p->vCnfs );
    Vec_VecFree( (Vec_Vec_t *)p->vId2Lit );
    Vec_IntFree( p->vIds );
    Vec_IntFree( p->vProofIds );
    Vec_IntFree( p->vAbs );
    Vec_IntFree( p->vValues );
    Vec_IntFree( p->vLits );
    Vec_IntFree( p->vIsopMem );
    Rnm_ManStop( p->pRnm, 0 );
//    Rf2_ManStop( p->pRf2, p->pPars->fVerbose );
    ABC_FREE( p->pTable );
    ABC_FREE( p->pSopSizes );
    ABC_FREE( p->pSops[1] );
    ABC_FREE( p->pSops );
    ABC_FREE( p );
}